

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prob.cpp
# Opt level: O3

bool discrete_check(int a,double *b)

{
  bool bVar1;
  ulong uVar2;
  long lVar3;
  char *pcVar4;
  double dVar5;
  
  if (0 < a) {
    uVar2 = 0;
    do {
      if (b[uVar2] <= 0.0 && b[uVar2] != 0.0) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr," \n",2);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"DISCRETE_CHECK - Warning!\n",0x1a);
        pcVar4 = "  Negative probabilities not allowed.\n";
        lVar3 = 0x26;
        goto LAB_00199f13;
      }
      uVar2 = uVar2 + 1;
    } while ((uint)a != uVar2);
  }
  dVar5 = r8vec_sum(a,b);
  if ((dVar5 != 0.0) || (NAN(dVar5))) {
    bVar1 = true;
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr," \n",2);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"DISCRETE_CHECK - Warning!\n",0x1a);
    pcVar4 = "  Total probablity is zero.\n";
    lVar3 = 0x1c;
LAB_00199f13:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar4,lVar3);
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool discrete_check ( int a, double b[] )

//****************************************************************************80
//
//  Purpose:
//
//    DISCRETE_CHECK checks the parameters of the Discrete CDF.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    15 October 2004
//
//  Author:
//
//    John Burkardt
//
//  Parameters:
//
//    Input, int A, the number of probabilities assigned.
//
//    Input, double B[A], the relative probabilities of
//    outcomes 1 through A.  Each entry must be nonnegative.
//
//    Output, bool DISCRETE_CHECK, is true if the parameters are legal.
//
{
  double b_sum;
  int j;

  for ( j = 0; j < a; j++ )
  {
    if ( b[j] < 0.0 )
    {
      cerr << " \n";
      cerr << "DISCRETE_CHECK - Warning!\n";
      cerr << "  Negative probabilities not allowed.\n";
      return false;
    }
  }

  b_sum = r8vec_sum ( a, b );

  if ( b_sum == 0.0 )
  {
    cerr << " \n";
    cerr << "DISCRETE_CHECK - Warning!\n";
    cerr << "  Total probablity is zero.\n";
    return false;
  }

  return true;
}